

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O3

void __thiscall argo::unparser::print_indent(unparser *this,int indent_level)

{
  writer *w;
  allocator local_51;
  string local_50;
  
  if (0 < indent_level) {
    do {
      w = this->m_writer;
      std::__cxx11::string::string((string *)&local_50,this->m_indent,&local_51);
      operator<<(w,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      indent_level = indent_level + -1;
    } while (indent_level != 0);
  }
  return;
}

Assistant:

void unparser::print_indent(int indent_level)
{
    for (int i = 0; i < indent_level; i++)
    {
        m_writer << m_indent;
    }
}